

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::Schema> __thiscall capnp::compiler::Compiler::Node::getBootstrapSchema(Node *this)

{
  bool bVar1;
  Impl *pIVar2;
  Workspace *pWVar3;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar4;
  long in_RSI;
  Maybe<capnp::Schema> MVar5;
  Schema local_68;
  Reader *local_60;
  Reader *finalSchema;
  Reader *_finalSchema625;
  CompiledModule *local_48;
  Content *content;
  CompiledModule *local_38;
  Content *_content620;
  SegmentReader *local_28;
  Reader *schema;
  Reader *_schema617;
  Node *this_local;
  
  this_local = this;
  local_28 = (SegmentReader *)
             kj::_::readMaybe<capnp::schema::Node::Reader>
                       ((Maybe<capnp::schema::Node::Reader> *)(in_RSI + 0x188));
  schema = (Reader *)local_28;
  if (local_28 == (SegmentReader *)0x0) {
    getContent((Node *)&content,(State)in_RSI);
    local_48 = (CompiledModule *)
               kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                         ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&content);
    local_38 = local_48;
    if (local_48 == (CompiledModule *)0x0) {
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this);
      aVar4 = extraout_RDX_03;
    }
    else if ((*(State *)&local_48->compiler == FINISHED) &&
            (bVar1 = kj::Maybe<capnp::Schema>::operator==
                               ((Maybe<capnp::Schema> *)
                                ((local_48->contentArena).super_MessageBuilder.arenaSpace + 0xf)),
            bVar1)) {
      local_60 = kj::_::readMaybe<capnp::schema::Node::Reader>
                           ((Maybe<capnp::schema::Node::Reader> *)
                            ((local_48->contentArena).super_MessageBuilder.arenaSpace + 0x11));
      finalSchema = local_60;
      if (local_60 == (Reader *)0x0) {
        kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this);
        aVar4 = extraout_RDX_01;
      }
      else {
        pIVar2 = CompiledModule::getCompiler(*(CompiledModule **)(in_RSI + 8));
        pWVar3 = Compiler::Impl::getWorkspace(pIVar2);
        local_68 = SchemaLoader::loadOnce(&pWVar3->bootstrapLoader,local_60);
        kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_68);
        aVar4 = extraout_RDX_00;
      }
    }
    else {
      kj::Maybe<capnp::Schema>::Maybe
                ((Maybe<capnp::Schema> *)this,
                 (Maybe<capnp::Schema> *)
                 ((local_48->contentArena).super_MessageBuilder.arenaSpace + 0xf));
      aVar4 = extraout_RDX_02;
    }
  }
  else {
    pIVar2 = CompiledModule::getCompiler(*(CompiledModule **)(in_RSI + 8));
    pWVar3 = Compiler::Impl::getWorkspace(pIVar2);
    _content620 = (Content *)SchemaLoader::loadOnce(&pWVar3->bootstrapLoader,(Reader *)local_28);
    kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,(Schema *)&_content620);
    aVar4 = extraout_RDX;
  }
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar5.ptr;
}

Assistant:

kj::Maybe<Schema> Compiler::Node::getBootstrapSchema() {
  KJ_IF_SOME(schema, loadedFinalSchema) {
    // We don't need to rebuild the bootstrap schema if we already have a final schema.
    return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(schema);
  } else KJ_IF_SOME(content, getContent(Content::BOOTSTRAP)) {
    if (content.state == Content::FINISHED && content.bootstrapSchema == kj::none) {
      // The bootstrap schema was discarded.  Copy it from the final schema.
      // (We can't just return the final schema because using it could trigger schema loader
      // callbacks that would deadlock.)
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(finalSchema);
      } else {
        return kj::none;
      }
    } else {
      return content.bootstrapSchema;
    }